

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O2

void __thiscall CVmRun::get_say_func(CVmRun *this,vm_val_t *val)

{
  vm_globalvar_t *pvVar1;
  anon_union_8_8_cb74652f_for_val aVar2;
  undefined4 uVar3;
  
  pvVar1 = this->say_func_;
  if (pvVar1 != (vm_globalvar_t *)0x0) {
    uVar3 = *(undefined4 *)&(pvVar1->val).field_0x4;
    aVar2 = (pvVar1->val).val;
    val->typ = (pvVar1->val).typ;
    *(undefined4 *)&val->field_0x4 = uVar3;
    val->val = aVar2;
    return;
  }
  val->typ = VM_NIL;
  return;
}

Assistant:

void CVmRun::get_say_func(vm_val_t *val) const
{
    /* 
     *   if we ever allocated a global to hold the 'say' function, return its
     *   value; otherwise, there's no 'say' function, so the result is nil 
     */
    if (say_func_ != 0)
        *val = say_func_->val;
    else
        val->set_nil();
}